

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_private_key_result_t
sign_start(ptls_sign_certificate_t *do_sign,ptls_t *tls,uint16_t *selected_algorithm,
          ptls_buffer_t *output,ptls_iovec_t input,uint16_t *algorithms,size_t num_algorithms)

{
  size_t __size;
  ptls_buffer_t *output_local;
  uint16_t *selected_algorithm_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *do_sign_local;
  ptls_iovec_t input_local;
  
  __size = input.len;
  msg("sign_start, in len: %ld algoriths %ld",__size,num_algorithms);
  retry_count = 0;
  in.base = (uint8_t *)malloc(__size);
  if (in.base == (uint8_t *)0x0) {
    msg("WHAT!!! CANT ALLOCATE %d BYTES!",__size);
    input_local.len._4_4_ = ptls_private_key_failure;
  }
  else {
    in.len = __size;
    memcpy(in.base,input.base,__size);
    algos = (uint16_t *)malloc(num_algorithms << 1);
    if (algos == (uint16_t *)0x0) {
      msg("WHAT!!! CANT ALLOCATE ALGOS %d BYTES!",num_algorithms << 1);
      input_local.len._4_4_ = ptls_private_key_failure;
    }
    else {
      memcpy(algos,algorithms,num_algorithms << 1);
      num_algos = num_algorithms;
      input_local.len._4_4_ = ptls_private_key_retry;
    }
  }
  return input_local.len._4_4_;
}

Assistant:

enum ptls_private_key_result_t sign_start(ptls_sign_certificate_t *do_sign,
                                          ptls_t *tls,
                                          uint16_t *selected_algorithm,
                                          ptls_buffer_t *output,
                                          ptls_iovec_t input,
                                          const uint16_t *algorithms,
                                          size_t num_algorithms)
{
    msg("sign_start, in len: %ld algoriths %ld", input.len, num_algorithms);
    /* Remove the comments from the following to have no offload:
    int rc = do_sign->cb(do_sign, tls, selected_algorithm, output, input, algorithms,
                         num_algorithms);
    if (rc != 0)
        return ptls_private_key_failure;
    return ptls_private_key_success;
    */
    retry_count = 0;
    in.base = malloc(input.len);
    if (!in.base)
    {
        msg("WHAT!!! CANT ALLOCATE %d BYTES!", input.len);
        return ptls_private_key_failure;
    }
    in.len = input.len;
    memcpy(in.base, input.base, input.len);
    algos = malloc(num_algorithms * sizeof(uint16_t));
    if (!algos)
    {
        msg("WHAT!!! CANT ALLOCATE ALGOS %d BYTES!",num_algorithms * sizeof(uint16_t));
        return ptls_private_key_failure;
    }
    memcpy(algos, algorithms, num_algorithms * sizeof(uint16_t));
    num_algos = num_algorithms;
    return ptls_private_key_retry;
}